

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

uint mg_exit_library(void)

{
  if (0 < mg_init_library_called) {
    mg_global_lock();
    mg_init_library_called = mg_init_library_called + -1;
    if (mg_init_library_called == 0) {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&pthread_mutex_attr);
      pthread_key_delete(sTlsKey);
      free(all_methods);
      all_methods = (char *)0x0;
      mg_global_unlock();
      pthread_mutex_destroy((pthread_mutex_t *)&global_lock_mutex);
    }
    else {
      mg_global_unlock();
    }
    return 1;
  }
  return 0;
}

Assistant:

CIVETWEB_API unsigned
mg_exit_library(void)
{
	if (mg_init_library_called <= 0) {
		return 0;
	}

	mg_global_lock();

	mg_init_library_called--;
	if (mg_init_library_called == 0) {
#if (defined(OPENSSL_API_1_0) || defined(OPENSSL_API_1_1)) && !defined(NO_SSL)
		if (mg_openssl_initialized) {
			uninitialize_openssl();
			mg_openssl_initialized = 0;
		}
#endif

#if defined(_WIN32)
		(void)WSACleanup();
		(void)pthread_mutex_destroy(&global_log_file_lock);
#else
		(void)pthread_mutexattr_destroy(&pthread_mutex_attr);
#endif

		(void)pthread_key_delete(sTlsKey);

#if defined(USE_LUA)
		lua_exit_optional_libraries();
#endif
		mg_free(all_methods);
		all_methods = NULL;

		mg_global_unlock();
		(void)pthread_mutex_destroy(&global_lock_mutex);
		return 1;
	}

	mg_global_unlock();
	return 1;
}